

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCopier.cxx
# Opt level: O0

bool __thiscall cmFileCopier::CheckValue(cmFileCopier *this,string *arg)

{
  cmExecutionStatus *pcVar1;
  bool bVar2;
  ulong uVar3;
  string *psVar4;
  reference pMVar5;
  ostream *poVar6;
  string local_520;
  ostringstream local_500 [8];
  ostringstream e_1;
  __normal_iterator<cmFileCopier::MatchRule_*,_std::vector<cmFileCopier::MatchRule,_std::allocator<cmFileCopier::MatchRule>_>_>
  local_388;
  __normal_iterator<cmFileCopier::MatchRule_*,_std::vector<cmFileCopier::MatchRule,_std::allocator<cmFileCopier::MatchRule>_>_>
  local_380;
  string local_378;
  undefined1 local_358 [8];
  ostringstream e;
  __normal_iterator<cmFileCopier::MatchRule_*,_std::vector<cmFileCopier::MatchRule,_std::allocator<cmFileCopier::MatchRule>_>_>
  local_1e0;
  __normal_iterator<cmFileCopier::MatchRule_*,_std::vector<cmFileCopier::MatchRule,_std::allocator<cmFileCopier::MatchRule>_>_>
  local_1d8;
  char local_1cd [13];
  string local_1c0;
  cmAlphaNum local_1a0;
  cmAlphaNum local_170;
  undefined1 local_140 [8];
  string regex;
  cmAlphaNum local_f0;
  string local_c0;
  cmAlphaNum local_a0;
  cmAlphaNum local_70;
  string local_40;
  string *local_20;
  string *arg_local;
  cmFileCopier *this_local;
  
  local_20 = arg;
  arg_local = (string *)this;
  switch(this->Doing) {
  case 2:
    uVar3 = std::__cxx11::string::empty();
    if (((uVar3 & 1) != 0) || (bVar2 = cmsys::SystemTools::FileIsFullPath(local_20), bVar2)) {
      std::__cxx11::string::operator=((string *)&this->Destination,(string *)local_20);
    }
    else {
      psVar4 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_(this->Makefile);
      cmAlphaNum::cmAlphaNum(&local_70,psVar4);
      cmAlphaNum::cmAlphaNum(&local_a0,'/');
      cmStrCat<std::__cxx11::string>(&local_40,&local_70,&local_a0,local_20);
      std::__cxx11::string::operator=((string *)&this->Destination,(string *)&local_40);
      std::__cxx11::string::~string((string *)&local_40);
    }
    this->Doing = 0;
    break;
  case 3:
    bVar2 = cmsys::SystemTools::FileIsFullPath(arg);
    if (bVar2) {
      std::__cxx11::string::operator=((string *)&this->FilesFromDir,(string *)local_20);
    }
    else {
      psVar4 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(this->Makefile);
      cmAlphaNum::cmAlphaNum(&local_f0,psVar4);
      cmAlphaNum::cmAlphaNum((cmAlphaNum *)((long)&regex.field_2 + 8),'/');
      cmStrCat<std::__cxx11::string>
                (&local_c0,&local_f0,(cmAlphaNum *)((long)&regex.field_2 + 8),local_20);
      std::__cxx11::string::operator=((string *)&this->FilesFromDir,(string *)&local_c0);
      std::__cxx11::string::~string((string *)&local_c0);
    }
    cmsys::SystemTools::ConvertToUnixSlashes(&this->FilesFromDir);
    this->Doing = 0;
    break;
  case 4:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->Files,arg);
    break;
  case 5:
    cmAlphaNum::cmAlphaNum(&local_170,'/');
    cmsys::Glob::PatternToRegex(&local_1c0,local_20,false,false);
    cmAlphaNum::cmAlphaNum(&local_1a0,&local_1c0);
    local_1cd[0] = '$';
    cmStrCat<char>((string *)local_140,&local_170,&local_1a0,local_1cd);
    std::__cxx11::string::~string((string *)&local_1c0);
    std::vector<cmFileCopier::MatchRule,std::allocator<cmFileCopier::MatchRule>>::
    emplace_back<std::__cxx11::string&>
              ((vector<cmFileCopier::MatchRule,std::allocator<cmFileCopier::MatchRule>> *)
               &this->MatchRules,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_140);
    local_1e0._M_current =
         (MatchRule *)
         std::vector<cmFileCopier::MatchRule,_std::allocator<cmFileCopier::MatchRule>_>::end
                   (&this->MatchRules);
    local_1d8 = __gnu_cxx::
                __normal_iterator<cmFileCopier::MatchRule_*,_std::vector<cmFileCopier::MatchRule,_std::allocator<cmFileCopier::MatchRule>_>_>
                ::operator-(&local_1e0,1);
    pMVar5 = __gnu_cxx::
             __normal_iterator<cmFileCopier::MatchRule_*,_std::vector<cmFileCopier::MatchRule,_std::allocator<cmFileCopier::MatchRule>_>_>
             ::operator*(&local_1d8);
    this->CurrentMatchRule = pMVar5;
    bVar2 = cmsys::RegularExpression::is_valid(&this->CurrentMatchRule->Regex);
    if (bVar2) {
      this->Doing = 0;
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_358);
      poVar6 = std::operator<<((ostream *)local_358,"could not compile PATTERN \"");
      poVar6 = std::operator<<(poVar6,(string *)local_20);
      std::operator<<(poVar6,"\".");
      pcVar1 = this->Status;
      std::__cxx11::ostringstream::str();
      cmExecutionStatus::SetError(pcVar1,&local_378);
      std::__cxx11::string::~string((string *)&local_378);
      this->Doing = 1;
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_358);
    }
    std::__cxx11::string::~string((string *)local_140);
    break;
  case 6:
    std::vector<cmFileCopier::MatchRule,std::allocator<cmFileCopier::MatchRule>>::
    emplace_back<std::__cxx11::string_const&>
              ((vector<cmFileCopier::MatchRule,std::allocator<cmFileCopier::MatchRule>> *)
               &this->MatchRules,arg);
    local_388._M_current =
         (MatchRule *)
         std::vector<cmFileCopier::MatchRule,_std::allocator<cmFileCopier::MatchRule>_>::end
                   (&this->MatchRules);
    local_380 = __gnu_cxx::
                __normal_iterator<cmFileCopier::MatchRule_*,_std::vector<cmFileCopier::MatchRule,_std::allocator<cmFileCopier::MatchRule>_>_>
                ::operator-(&local_388,1);
    pMVar5 = __gnu_cxx::
             __normal_iterator<cmFileCopier::MatchRule_*,_std::vector<cmFileCopier::MatchRule,_std::allocator<cmFileCopier::MatchRule>_>_>
             ::operator*(&local_380);
    this->CurrentMatchRule = pMVar5;
    bVar2 = cmsys::RegularExpression::is_valid(&this->CurrentMatchRule->Regex);
    if (bVar2) {
      this->Doing = 0;
    }
    else {
      std::__cxx11::ostringstream::ostringstream(local_500);
      poVar6 = std::operator<<((ostream *)local_500,"could not compile REGEX \"");
      poVar6 = std::operator<<(poVar6,(string *)local_20);
      std::operator<<(poVar6,"\".");
      pcVar1 = this->Status;
      std::__cxx11::ostringstream::str();
      cmExecutionStatus::SetError(pcVar1,&local_520);
      std::__cxx11::string::~string((string *)&local_520);
      this->Doing = 1;
      std::__cxx11::ostringstream::~ostringstream(local_500);
    }
    break;
  case 7:
    bVar2 = CheckPermissions(this,arg,&this->FilePermissions);
    if (!bVar2) {
      this->Doing = 1;
    }
    break;
  case 8:
    bVar2 = CheckPermissions(this,arg,&this->DirPermissions);
    if (!bVar2) {
      this->Doing = 1;
    }
    break;
  case 9:
    bVar2 = CheckPermissions(this,arg,&(this->CurrentMatchRule->Properties).Permissions);
    if (!bVar2) {
      this->Doing = 1;
    }
    break;
  default:
    return false;
  }
  return true;
}

Assistant:

bool cmFileCopier::CheckValue(std::string const& arg)
{
  switch (this->Doing) {
    case DoingFiles:
      this->Files.push_back(arg);
      break;
    case DoingDestination:
      if (arg.empty() || cmSystemTools::FileIsFullPath(arg)) {
        this->Destination = arg;
      } else {
        this->Destination =
          cmStrCat(this->Makefile->GetCurrentBinaryDirectory(), '/', arg);
      }
      this->Doing = DoingNone;
      break;
    case DoingFilesFromDir:
      if (cmSystemTools::FileIsFullPath(arg)) {
        this->FilesFromDir = arg;
      } else {
        this->FilesFromDir =
          cmStrCat(this->Makefile->GetCurrentSourceDirectory(), '/', arg);
      }
      cmSystemTools::ConvertToUnixSlashes(this->FilesFromDir);
      this->Doing = DoingNone;
      break;
    case DoingPattern: {
      // Convert the pattern to a regular expression.  Require a
      // leading slash and trailing end-of-string in the matched
      // string to make sure the pattern matches only whole file
      // names.
      std::string regex =
        cmStrCat('/', cmsys::Glob::PatternToRegex(arg, false), '$');
      this->MatchRules.emplace_back(regex);
      this->CurrentMatchRule = &*(this->MatchRules.end() - 1);
      if (this->CurrentMatchRule->Regex.is_valid()) {
        this->Doing = DoingNone;
      } else {
        std::ostringstream e;
        e << "could not compile PATTERN \"" << arg << "\".";
        this->Status.SetError(e.str());
        this->Doing = DoingError;
      }
    } break;
    case DoingRegex:
      this->MatchRules.emplace_back(arg);
      this->CurrentMatchRule = &*(this->MatchRules.end() - 1);
      if (this->CurrentMatchRule->Regex.is_valid()) {
        this->Doing = DoingNone;
      } else {
        std::ostringstream e;
        e << "could not compile REGEX \"" << arg << "\".";
        this->Status.SetError(e.str());
        this->Doing = DoingError;
      }
      break;
    case DoingPermissionsFile:
      if (!this->CheckPermissions(arg, this->FilePermissions)) {
        this->Doing = DoingError;
      }
      break;
    case DoingPermissionsDir:
      if (!this->CheckPermissions(arg, this->DirPermissions)) {
        this->Doing = DoingError;
      }
      break;
    case DoingPermissionsMatch:
      if (!this->CheckPermissions(
            arg, this->CurrentMatchRule->Properties.Permissions)) {
        this->Doing = DoingError;
      }
      break;
    default:
      return false;
  }
  return true;
}